

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkFindCi(Abc_Ntk_t *pNtk,char *pName)

{
  int iVar1;
  int Num;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    iVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,2);
    if (iVar1 < 0) {
      iVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,5);
      if (iVar1 < 0) {
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else {
        pNtk_local = (Abc_Ntk_t *)Abc_NtkObj(pNtk,iVar1);
      }
    }
    else {
      pNtk_local = (Abc_Ntk_t *)Abc_NtkObj(pNtk,iVar1);
    }
    return (Abc_Obj_t *)pNtk_local;
  }
  __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                ,0x21c,"Abc_Obj_t *Abc_NtkFindCi(Abc_Ntk_t *, char *)");
}

Assistant:

Abc_Obj_t * Abc_NtkFindCi( Abc_Ntk_t * pNtk, char * pName )
{
    int Num;
    assert( !Abc_NtkIsNetlist(pNtk) );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_PI );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BO );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    return NULL;
}